

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall
Catch::Matchers::Impl::Generic::
AllOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::match
          (AllOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *expr)

{
  pointer pPVar1;
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pMVar2;
  ulong uVar3;
  char cVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar3 = 0;
  do {
    uVar5 = uVar3;
    pPVar1 = (this->m_matchers).
             super__Vector_base<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (long)(this->m_matchers).
                  super__Vector_base<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 3;
    if (uVar6 <= uVar5) break;
    pMVar2 = pPVar1[uVar5].m_p;
    cVar4 = (**(code **)((long)(pMVar2->super_SharedImpl<Catch::IShared>).super_IShared.
                               super_NonCopyable + 0x28))(pMVar2,expr);
    uVar3 = uVar5 + 1;
  } while (cVar4 != '\0');
  return uVar6 <= uVar5;
}

Assistant:

virtual bool match( ExpressionT const& expr ) const
            {
                for( std::size_t i = 0; i < m_matchers.size(); ++i )
                    if( !m_matchers[i]->match( expr ) )
                        return false;
                return true;
            }